

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto3_unittest::ForeignMessage::_InternalSerialize
          (ForeignMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int32_t value;
  ulong uVar1;
  uint8_t *puVar2;
  
  if (((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
       (undefined1  [12])0x0) && (value = (this->field_0)._impl_.c_, value != 0)) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,value,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ForeignMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ForeignMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.ForeignMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // int32 c = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (this_._internal_c() != 0) {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_c(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.ForeignMessage)
  return target;
}